

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void tdefl_start_static_block(tdefl_compressor *d)

{
  mz_uint8 *pmVar1;
  mz_uint len;
  mz_uint bits;
  mz_uint8 *p;
  mz_uint i;
  tdefl_compressor *d_local;
  
  _len = d->m_huff_code_sizes;
  for (p._4_4_ = 0; p._4_4_ < 0x90; p._4_4_ = p._4_4_ + 1) {
    (*_len)[0] = '\b';
    _len = (mz_uint8 (*) [288])(*_len + 1);
  }
  for (; p._4_4_ < 0x100; p._4_4_ = p._4_4_ + 1) {
    (*_len)[0] = '\t';
    _len = (mz_uint8 (*) [288])(*_len + 1);
  }
  for (; p._4_4_ < 0x118; p._4_4_ = p._4_4_ + 1) {
    (*_len)[0] = '\a';
    _len = (mz_uint8 (*) [288])(*_len + 1);
  }
  for (; p._4_4_ < 0x120; p._4_4_ = p._4_4_ + 1) {
    (*_len)[0] = '\b';
    _len = (mz_uint8 (*) [288])(*_len + 1);
  }
  memset(d->m_huff_code_sizes + 1,5,0x20);
  tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
  tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
  d->m_bit_buffer = 1 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
  d->m_bits_in = d->m_bits_in + 2;
  while (7 < d->m_bits_in) {
    if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
      pmVar1 = d->m_pOutput_buf;
      d->m_pOutput_buf = pmVar1 + 1;
      *pmVar1 = (mz_uint8)d->m_bit_buffer;
    }
    d->m_bit_buffer = d->m_bit_buffer >> 8;
    d->m_bits_in = d->m_bits_in - 8;
  }
  return;
}

Assistant:

static void tdefl_start_static_block(tdefl_compressor *d) {
  mz_uint i;
  mz_uint8 *p = &d->m_huff_code_sizes[0][0];

  for (i = 0; i <= 143; ++i)
    *p++ = 8;
  for (; i <= 255; ++i)
    *p++ = 9;
  for (; i <= 279; ++i)
    *p++ = 7;
  for (; i <= 287; ++i)
    *p++ = 8;

  memset(d->m_huff_code_sizes[1], 5, 32);

  tdefl_optimize_huffman_table(d, 0, 288, 15, MZ_TRUE);
  tdefl_optimize_huffman_table(d, 1, 32, 15, MZ_TRUE);

  TDEFL_PUT_BITS(1, 2);
}